

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O2

leveldb_t * leveldb_open(leveldb_options_t *options,char *name,char **errptr)

{
  bool bVar1;
  leveldb_t *plVar2;
  allocator local_49;
  DB local_48;
  DB *db;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_49);
  leveldb::DB::Open(&local_48,&options->rep,&local_38,&db);
  bVar1 = SaveError(errptr,(Status *)&local_48);
  leveldb::Status::~Status((Status *)&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    plVar2 = (leveldb_t *)0x0;
  }
  else {
    plVar2 = (leveldb_t *)operator_new(8);
    plVar2->rep = db;
  }
  return plVar2;
}

Assistant:

leveldb_t* leveldb_open(const leveldb_options_t* options, const char* name,
                        char** errptr) {
  DB* db;
  if (SaveError(errptr, DB::Open(options->rep, std::string(name), &db))) {
    return nullptr;
  }
  leveldb_t* result = new leveldb_t;
  result->rep = db;
  return result;
}